

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetrepaintmanager.cpp
# Opt level: O3

QPlatformTextureList * widgetTexturesFor(QWidget *tlw,QWidget *widget)

{
  undefined8 *puVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  QWidget *pQVar5;
  QPlatformTextureList *pQVar6;
  undefined8 *puVar7;
  
  QWidgetPrivate::createTLExtra((QWidgetPrivate *)tlw);
  puVar7 = *(undefined8 **)(*(long *)(*(long *)(tlw + 3) + 8) + 200);
  puVar1 = *(undefined8 **)(*(long *)(*(long *)(tlw + 3) + 8) + 0xd0);
  do {
    if (puVar7 == puVar1) {
      if (((*(byte *)(*(long *)&widget->field_0x8 + 0x253) & 2) != 0) &&
         (-2 < (char)QtGlobalStatic::
                     Holder<(anonymous_namespace)::Q_QGS_qt_dummy_platformTextureList>::guard.
                     _q_value.super___atomic_base<signed_char>._M_i)) {
        pQVar6 = (QPlatformTextureList *)
                 QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_dummy_platformTextureList>_>
                 ::instance();
        return pQVar6;
      }
      return (QPlatformTextureList *)0x0;
    }
    iVar3 = QPlatformTextureList::count();
    if (0 < iVar3) {
      iVar3 = 0;
      do {
        pQVar5 = (QWidget *)QPlatformTextureList::source((int)*puVar7);
        bVar2 = hasPlatformWindow(pQVar5);
        if ((bVar2 && pQVar5 == widget) ||
           ((bVar2 = hasPlatformWindow(pQVar5), !bVar2 &&
            (pQVar5 = QWidget::nativeParentWidget(pQVar5), pQVar5 == widget)))) {
          return (QPlatformTextureList *)*puVar7;
        }
        iVar3 = iVar3 + 1;
        iVar4 = QPlatformTextureList::count();
      } while (iVar3 < iVar4);
    }
    puVar7 = puVar7 + 1;
  } while( true );
}

Assistant:

static QPlatformTextureList *widgetTexturesFor(QWidget *tlw, QWidget *widget)
{
    for (const auto &tl : QWidgetPrivate::get(tlw)->topData()->widgetTextures) {
        Q_ASSERT(!tl->isEmpty());
        for (int i = 0; i < tl->count(); ++i) {
            QWidget *w = static_cast<QWidget *>(tl->source(i));
            if ((hasPlatformWindow(w) && w == widget) || (!hasPlatformWindow(w) && w->nativeParentWidget() == widget))
                return tl.get();
        }
    }

    if (QWidgetPrivate::get(widget)->textureChildSeen)
        return qt_dummy_platformTextureList();

    return nullptr;
}